

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_choices_validation_case_sensitive(void)

{
  cargo_t ctx;
  int iVar1;
  cargo_validation_t *vd;
  char *pcVar2;
  cargo_t cargo;
  char *str;
  char *args [3];
  cargo_t local_38;
  void *local_30;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  
  iVar1 = cargo_init(&local_38,0,"program");
  if (iVar1 == 0) {
    local_30 = (void *)0x0;
    iVar1 = cargo_add_option(local_38,0,"--alpha -a",(char *)0x0,"s");
    ctx = local_38;
    if (iVar1 == 0) {
      vd = cargo_validate_choices(CARGO_VALIDATE_CHOICES_CASE_SENSITIVE,CARGO_STRING,2,"abc","def");
      iVar1 = cargo_add_validation(ctx,CARGO_VALIDATION_NONE,"--alpha",vd);
      if (iVar1 == 0) {
        local_18 = "abc";
        local_28 = "program";
        pcStack_20 = "--alpha";
        pcVar2 = (char *)0x0;
        iVar1 = cargo_parse(local_38,0,1,3,&local_28);
        if (iVar1 == 0) {
          local_18 = "def";
          local_28 = "program";
          pcStack_20 = "--alpha";
          iVar1 = cargo_parse(local_38,0,1,3,&local_28);
          if (iVar1 == 0) {
            local_18 = "klmn";
            local_28 = "program";
            pcStack_20 = "--alpha";
            iVar1 = cargo_parse(local_38,0,1,3,&local_28);
            if (iVar1 < 0) {
              local_18 = "ABC";
              local_28 = "program";
              pcStack_20 = "--alpha";
              iVar1 = cargo_parse(local_38,0,1,3,&local_28);
              if (iVar1 < 0) {
                local_18 = "DEF";
                local_28 = "program";
                pcStack_20 = "--alpha";
                iVar1 = cargo_parse(local_38,0,1,3,&local_28);
                if (-1 < iVar1) {
                  pcVar2 = "Expected parse failure for DEF";
                }
              }
              else {
                pcVar2 = "Expected parse failure for ABC";
              }
            }
            else {
              pcVar2 = "Expected parse failure for klmn";
            }
          }
          else {
            pcVar2 = "Failed to parse";
          }
        }
        else {
          pcVar2 = "Failed to parse";
        }
      }
      else {
        pcVar2 = "Failed to add validation";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    if (local_30 != (void *)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(local_30);
      }
      else {
        (*replaced_cargo_free)(local_30);
      }
      local_30 = (void *)0x0;
    }
    cargo_destroy(&local_38);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_choices_validation_case_sensitive)
{
    char *str = NULL;
    _CARGO_ADD_TEST_VALIDATE("s", &str,
            cargo_validate_choices,
            CARGO_VALIDATE_CHOICES_CASE_SENSITIVE,
            CARGO_STRING,
            2, "abc", "def");
    _CARGO_TEST_VALIDATE_VALUE(abc, 0);
    _CARGO_TEST_VALIDATE_VALUE(def, 0);
    _CARGO_TEST_VALIDATE_VALUE(klmn, 1);
    _CARGO_TEST_VALIDATE_VALUE(ABC, 1);
    _CARGO_TEST_VALIDATE_VALUE(DEF, 1);
    _TEST_CLEANUP();
    _cargo_xfree(&str);
}